

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cc
# Opt level: O3

void __thiscall pstack::LzmaReader::LzmaReader(LzmaReader *this,csptr *upstream_)

{
  _Rb_tree_header *p_Var1;
  Reader *this_00;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 extraout_var;
  Exception *pEVar9;
  Off OVar10;
  undefined1 *puStack_220;
  Exception local_218;
  undefined8 uStack_78;
  lzma_stream_flags options;
  uchar local_34 [8];
  uint8_t footer [12];
  
  (this->super_Reader).super_enable_shared_from_this<pstack::Reader>._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Reader).super_enable_shared_from_this<pstack::Reader>._M_weak_this.
  super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR__LzmaReader_0017bb98;
  this->index = (lzma_index *)0x0;
  this->memlimit = 0xffffffffffffffff;
  this->pos = 0;
  (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  uVar3 = *(undefined4 *)
           &(upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  uVar4 = *(undefined4 *)
           ((long)&(upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr + 4);
  uVar5 = *(undefined4 *)
           &(upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  uVar6 = *(undefined4 *)
           ((long)&(upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_refcount._M_pi + 4);
  (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   &(this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       uVar3;
  *(undefined4 *)
   ((long)&(this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr + 4) = uVar4;
  *(undefined4 *)
   &(this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = uVar5;
  *(undefined4 *)
   ((long)&(this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = uVar6;
  (upstream_->super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  p_Var1 = &(this->lzBlocks)._M_t._M_impl.super__Rb_tree_header;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lzBlocks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  options.reserved_bool5 = '\0';
  options.reserved_bool6 = '\0';
  options.reserved_bool7 = '\0';
  options.reserved_bool8 = '\0';
  options.reserved_int1 = 0;
  options.reserved_enum2 = LZMA_RESERVED_ENUM;
  options.reserved_enum3 = LZMA_RESERVED_ENUM;
  options.reserved_enum4 = LZMA_RESERVED_ENUM;
  options.reserved_bool1 = '\0';
  options.reserved_bool2 = '\0';
  options.reserved_bool3 = '\0';
  options.reserved_bool4 = '\0';
  options.backward_size = 0;
  options.check = LZMA_CHECK_NONE;
  options.reserved_enum1 = LZMA_RESERVED_ENUM;
  uStack_78 = 0;
  options.version = 0;
  options._4_4_ = 0;
  puStack_220 = (undefined1 *)0x162b3f;
  iVar8 = (*((this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_Reader[8])();
  OVar10 = CONCAT44(extraout_var,iVar8) - 0xc;
  puStack_220 = (undefined1 *)0x162b5b;
  Reader::readObj<unsigned_char>
            ((this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,OVar10,local_34,0xc);
  puStack_220 = (undefined1 *)0x162b68;
  iVar8 = lzma_stream_footer_decode(&uStack_78);
  uVar7 = options._0_8_;
  if (iVar8 != 0) {
    puStack_220 = (undefined1 *)0x162bde;
    pEVar9 = (Exception *)__cxa_allocate_exception(0x1a0);
    puStack_220 = (undefined1 *)0x162bf7;
    memset(&local_218,0,0x1a0);
    puStack_220 = (undefined1 *)0x162bff;
    Exception::Exception(&local_218);
    puStack_220 = (undefined1 *)0x162c1a;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_218.str,"LZMA error reading footer: ",0x1b);
    puStack_220 = (undefined1 *)0x162c25;
    std::ostream::operator<<(&local_218.str,iVar8);
    puStack_220 = (undefined1 *)0x162c34;
    Exception::Exception(pEVar9,&local_218);
    puStack_220 = &LAB_00162c4a;
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  OVar10 = OVar10 - options._0_8_;
  lVar2 = -(options._0_8_ + 0xf & 0xfffffffffffffff0);
  this_00 = (this->upstream).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  *(undefined8 *)((long)&puStack_220 + lVar2) = 0x162b9a;
  Reader::readObj<unsigned_char>(this_00,OVar10,(uchar *)((long)&local_218 + lVar2),uVar7);
  uVar7 = options._0_8_;
  *(undefined8 *)((long)&puStack_220 + lVar2) = 0x162bb9;
  iVar8 = lzma_index_buffer_decode
                    (&this->index,&this->memlimit,allocator()::alloc,
                     (uchar *)((long)&local_218 + lVar2),&this->pos,uVar7);
  if (iVar8 == 0) {
    return;
  }
  *(undefined8 *)((long)&puStack_220 + lVar2) = 0x162c56;
  pEVar9 = (Exception *)__cxa_allocate_exception(0x1a0);
  *(undefined8 *)((long)&puStack_220 + lVar2) = 0x162c6f;
  memset(&local_218,0,0x1a0);
  *(undefined8 *)((long)&puStack_220 + lVar2) = 0x162c77;
  Exception::Exception(&local_218);
  *(undefined8 *)((long)&puStack_220 + lVar2) = 0x162c8f;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_218.str,"can\'t decode index buffer",0x19);
  *(undefined8 *)((long)&puStack_220 + lVar2) = 0x162c9e;
  Exception::Exception(pEVar9,&local_218);
  *(undefined1 **)((long)&puStack_220 + lVar2) = &LAB_00162cb4;
  __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

LzmaReader::LzmaReader(Reader::csptr upstream_)
    : index{}
    , upstream{std::move(upstream_)}
{
   lzma_stream_flags options{};

   // read the last LZMA_STREAM_HEADER_SIZE bytes into footer.
   uint8_t footer[LZMA_STREAM_HEADER_SIZE];
   size_t off = upstream->size() - sizeof footer;
   upstream->readObj(off, footer, sizeof footer);

   auto rc = lzma_stream_footer_decode(&options, footer);
   if (rc != LZMA_OK)
       throw (Exception() << "LZMA error reading footer: " << rc);
   off -= options.backward_size;
   uint8_t indexBuffer[options.backward_size];
   upstream->readObj(off, indexBuffer, options.backward_size);
   rc = lzma_index_buffer_decode(&index, &memlimit, allocator(), indexBuffer, &pos,
         options.backward_size);
   if (rc != LZMA_OK)
       throw (Exception() << "can't decode index buffer");
}